

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O2

void CTcIdFixup::add_fixup(CTcIdFixup **list_head,CTcDataStream *ds,ulong ofs,ulong id)

{
  CTcIdFixup *pCVar1;
  
  pCVar1 = (CTcIdFixup *)CTcPrsMem::alloc(G_prsmem,0x20);
  pCVar1->ds_ = ds;
  pCVar1->ofs_ = ofs;
  pCVar1->id_ = id;
  pCVar1->nxt_ = (CTcIdFixup *)0x0;
  pCVar1->nxt_ = *list_head;
  *list_head = pCVar1;
  return;
}

Assistant:

void CTcIdFixup::add_fixup(CTcIdFixup **list_head, class CTcDataStream *ds,
                           ulong ofs, ulong id)
{
    CTcIdFixup *fixup;
    
    /* create the new fixup object */
    fixup = new (G_prsmem) CTcIdFixup(ds, ofs, id);

    /* link it in at the head of the list */
    fixup->nxt_ = *list_head;
    *list_head = fixup;
}